

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall
p2t::Sweep::FillLeftAboveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  Point *pb;
  Point *pc;
  Orientation OVar2;
  Node *node_00;
  
  while( true ) {
    node_00 = node;
    node = node_00->prev;
    pb = node->point;
    dVar1 = pb->x;
    pc = edge->p;
    if (dVar1 < pc->x || dVar1 == pc->x) break;
    OVar2 = Orient2d(edge->q,pb,pc);
    if (OVar2 == CW) {
      FillLeftBelowEdgeEvent(this,tcx,edge,node_00);
      node = node_00;
    }
  }
  return;
}

Assistant:

void Sweep::FillLeftAboveEdgeEvent(SweepContext& tcx, Edge* edge, Node* node)
{
  while (node->prev->point->x > edge->p->x) {
    // Check if next node is below the edge
    if (Orient2d(*edge->q, *node->prev->point, *edge->p) == CW) {
      FillLeftBelowEdgeEvent(tcx, edge, *node);
    } else {
      node = node->prev;
    }
  }
}